

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  deUint32 dVar1;
  Resources *ptr;
  CreateThread<vkt::api::(anonymous_namespace)::Buffer> *this_00;
  allocator_type *__a;
  ulong __n;
  pointer this_01;
  bool bVar2;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_e0;
  Parameters params_local;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  resources;
  ThreadGroup threads;
  SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources> local_78;
  Environment env;
  
  params_local.usage = (VkBufferUsageFlags)params.size;
  params_local.size = (VkDeviceSize)context;
  dVar1 = getDefaultTestThreadCount();
  Environment::Environment(&env,(Context *)this,1);
  __n = (ulong)dVar1;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  ::vector(&resources,__n,__a);
  ThreadGroup::ThreadGroup(&threads);
  this_01 = resources.
            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (bVar2 = __n != 0, __n = __n - 1, bVar2) {
    ptr = (Resources *)operator_new(1);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::SharedPtr(&local_78,ptr);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::operator=(this_01,&local_78);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::release(&local_78);
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::Buffer> *)operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::Buffer>::CreateThread
              (this_00,&env,this_01->m_ptr,&params_local);
    local_e0.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this_00;
    ThreadGroup::add(&threads,&local_e0);
    if ((CreateThread<vkt::api::(anonymous_namespace)::Buffer> *)
        local_e0.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::Buffer> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_e0.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_e0.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    this_01 = this_01 + 1;
  }
  ThreadGroup::run(__return_storage_ptr__,&threads);
  ThreadGroup::~ThreadGroup(&threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  ::~vector(&resources);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}